

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

counting_iterator __thiscall
fmt::v6::internal::float_writer<char>::prettify<fmt::v6::internal::counting_iterator>
          (float_writer<char> *this,counting_iterator it)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  bool bVar4;
  uint uVar5;
  counting_iterator it_1;
  counting_iterator cVar6;
  size_t sVar7;
  int num_zeros;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  byte bVar14;
  ulong uVar15;
  
  uVar9 = this->num_digits_;
  uVar8 = this->exp_;
  uVar13 = (ulong)(int)uVar9;
  uVar11 = uVar8 + uVar9;
  uVar1 = *(uint *)&(this->specs_).field_0x4;
  if ((uVar1 & 0xff) == 1) {
    uVar8 = (this->specs_).precision - uVar9;
    bVar14 = (byte)(uVar1 >> 0x15) & 0 < (int)uVar8;
    uVar10 = 1;
    if ((long)uVar13 < 1) {
      uVar10 = uVar13;
    }
    uVar15 = 0;
    if (bVar14 != 0) {
      uVar15 = (ulong)uVar8;
    }
    cVar6 = write_exponent<char,fmt::v6::internal::counting_iterator>
                      (uVar11 - 1,
                       (counting_iterator)
                       ((long)this->digits_ +
                       (ulong)(1 < (int)uVar9 | bVar14) +
                       uVar15 + ~(ulong)(this->digits_ + uVar10) + uVar13 + it.count_ + 3));
    return (counting_iterator)cVar6.count_;
  }
  if ((int)uVar8 < 0) {
    if ((int)uVar11 < 1) {
      uVar12 = -uVar11;
      uVar8 = (this->specs_).precision;
      uVar5 = uVar12;
      if (SBORROW4(uVar8,uVar12) != (int)(uVar8 + uVar11) < 0) {
        uVar5 = uVar8;
      }
      if ((int)uVar8 < 0) {
        uVar5 = uVar12;
      }
      if (0 < (int)uVar9 && (uVar1 >> 0x15 & 1) == 0) {
        do {
          if (this->digits_[(ulong)uVar9 - 1] != '0') goto LAB_0012e555;
          bVar4 = 1 < (int)uVar9;
          uVar9 = uVar9 - 1;
        } while (bVar4);
        uVar9 = 0;
      }
      if (uVar5 == 0 && uVar9 == 0) {
        cVar6.count_ = it.count_ + 1;
      }
      else {
LAB_0012e555:
        uVar13 = (ulong)(int)uVar9;
        cVar6.count_ = ((it.count_ + (~((int)uVar5 >> 0x1f) & uVar5)) -
                       ((long)uVar13 >> 0x3f & uVar13)) + uVar13 + 2;
      }
    }
    else {
      pcVar3 = this->digits_;
      uVar10 = (ulong)uVar11;
      if ((uVar1 >> 0x15 & 1) == 0) {
        if ((int)uVar11 <= (int)uVar9) {
          uVar9 = uVar11;
        }
        for (; (long)uVar10 < (long)uVar13; uVar13 = uVar13 - 1) {
          if (pcVar3[uVar13 - 1] != '0') {
            uVar9 = (uint)uVar13;
            break;
          }
        }
        uVar10 = (long)(int)uVar9 - uVar10;
        cVar6.count_ = (size_t)(pcVar3 + (((ulong)(uVar9 != uVar11) +
                                          (it.count_ - (long)pcVar3) + (long)(int)uVar9) -
                                         ((long)uVar10 >> 0x3f & uVar10)));
      }
      else {
        iVar2 = (this->specs_).precision;
        uVar8 = iVar2 - uVar9;
        cVar6.count_ = (size_t)(pcVar3 + (it.count_ - (long)pcVar3) +
                                         (uVar13 - ((long)(uVar13 - uVar10) >> 0x3f &
                                                   uVar13 - uVar10)) + 1);
        if (uVar8 != 0 && (int)uVar9 <= iVar2) {
          cVar6.count_ = (size_t)(pcVar3 + (it.count_ - (long)pcVar3) +
                                           (uVar13 - ((long)(uVar13 - uVar10) >> 0x3f &
                                                     uVar13 - uVar10)) + 1 +
                                 (~((int)uVar8 >> 0x1f) & uVar8));
        }
      }
    }
  }
  else {
    sVar7 = ((uVar8 + it.count_) - ((long)uVar13 >> 0x3f & uVar13)) + uVar13;
    cVar6.count_ = sVar7;
    if ((uVar1 >> 0x15 & 1) != 0) {
      iVar2 = (this->specs_).precision;
      uVar9 = iVar2 - uVar11;
      if (uVar9 == 0 || iVar2 < (int)uVar11) {
        cVar6.count_ = sVar7 + 2;
        if ((uVar1 & 0xff) == 2) {
          cVar6.count_ = sVar7 + 1;
        }
      }
      else {
        cVar6.count_ = sVar7 + 1 + (ulong)uVar9;
      }
    }
  }
  return (counting_iterator)cVar6.count_;
}

Assistant:

It prettify(It it) const {
    // pow(10, full_exp - 1) <= v <= pow(10, full_exp).
    int full_exp = num_digits_ + exp_;
    if (specs_.format == float_format::exp) {
      // Insert a decimal point after the first digit and add an exponent.
      *it++ = static_cast<Char>(*digits_);
      int num_zeros = specs_.precision - num_digits_;
      bool trailing_zeros = num_zeros > 0 && specs_.trailing_zeros;
      if (num_digits_ > 1 || trailing_zeros) *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + 1, digits_ + num_digits_, it);
      if (trailing_zeros)
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      *it++ = static_cast<Char>(specs_.upper ? 'E' : 'e');
      return write_exponent<Char>(full_exp - 1, it);
    }
    if (num_digits_ <= full_exp) {
      // 1234e7 -> 12340000000[.0+]
      it = copy_str<Char>(digits_, digits_ + num_digits_, it);
      it = std::fill_n(it, full_exp - num_digits_, static_cast<Char>('0'));
      if (specs_.trailing_zeros) {
        *it++ = decimal_point_;
        int num_zeros = specs_.precision - full_exp;
        if (num_zeros <= 0) {
          if (specs_.format != float_format::fixed)
            *it++ = static_cast<Char>('0');
          return it;
        }
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
        if (num_zeros > 1000)
          throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else if (full_exp > 0) {
      // 1234e-2 -> 12.34[0+]
      it = copy_str<Char>(digits_, digits_ + full_exp, it);
      if (!specs_.trailing_zeros) {
        // Remove trailing zeros.
        int num_digits = num_digits_;
        while (num_digits > full_exp && digits_[num_digits - 1] == '0')
          --num_digits;
        if (num_digits != full_exp) *it++ = decimal_point_;
        return copy_str<Char>(digits_ + full_exp, digits_ + num_digits, it);
      }
      *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + full_exp, digits_ + num_digits_, it);
      if (specs_.precision > num_digits_) {
        // Add trailing zeros.
        int num_zeros = specs_.precision - num_digits_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else {
      // 1234e-6 -> 0.001234
      *it++ = static_cast<Char>('0');
      int num_zeros = -full_exp;
      if (specs_.precision >= 0 && specs_.precision < num_zeros)
        num_zeros = specs_.precision;
      int num_digits = num_digits_;
      if (!specs_.trailing_zeros)
        while (num_digits > 0 && digits_[num_digits - 1] == '0') --num_digits;
      if (num_zeros != 0 || num_digits != 0) {
        *it++ = decimal_point_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
        it = copy_str<Char>(digits_, digits_ + num_digits, it);
      }
    }
    return it;
  }